

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O2

void __thiscall VFS::CVFS::CVFSDir::InternalAppendChild(CVFSDir *this,VFSNode *Child)

{
  vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_> *this_00;
  bool bVar1;
  long lVar2;
  pointer psVar3;
  ulong uVar4;
  string local_70;
  string local_50;
  
  this_00 = &this->m_Childs;
  lVar2 = 0;
  uVar4 = 0;
  do {
    psVar3 = (this->m_Childs).
             super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_Childs).
                      super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4) <= uVar4) {
LAB_0010c0ff:
      std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
      ::insert(this_00,(shared_ptr<VFS::CVFSNode> *)
                       ((long)&(psVar3->
                               super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                       + lVar2),Child);
      return;
    }
    CVFSNode::Name_abi_cxx11_
              (&local_70,
               (Child->super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    CVFSNode::Name_abi_cxx11_
              (&local_50,
               *(CVFSNode **)
                ((long)&(((this_00->
                          super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                lVar2));
    bVar1 = std::operator<(&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar1) {
      psVar3 = (this_00->
               super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      goto LAB_0010c0ff;
    }
    uVar4 = uVar4 + 1;
    lVar2 = lVar2 + 0x10;
  } while( true );
}

Assistant:

void InternalAppendChild(VFSNode Child)
                    {
                        size_t Pos = 0;

                        //Sorts the data ascending.
                        for (Pos = 0; Pos < m_Childs.size(); Pos++)
                        {
                            if(Child->Name() < m_Childs[Pos]->Name())
                                break;
                        }
                        
                        m_Childs.insert(m_Childs.begin() + Pos, Child);
                    }